

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# submit-2AddPointBeforeQueryPolygon.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
QueryPolygonFromAddPointBeforeQueryPolygon
          (int n,vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 *polygon)

{
  int iVar1;
  reference pvVar2;
  pGridSet in_RDX;
  int in_ESI;
  pGridSet in_RDI;
  double point [2];
  int i_1;
  int i;
  GridSet grid_set;
  pGridSet p_gs;
  int local_88;
  int local_84;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  
  p_gs = in_RDI;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x10c24c);
  for (local_84 = 0; local_84 < in_ESI; local_84 = local_84 + 1) {
    pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)in_RDX,(long)local_84);
    pgon[local_84][0] = pvVar2->first;
    pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
             operator[]((vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         *)in_RDX,(long)local_84);
    pgon[local_84][1] = pvVar2->second;
  }
  GridSetup((double (*) [2])grid_set.maxx,grid_set.minx._4_4_,grid_set.minx._0_4_,
            (pGridSet)grid_set._8_8_);
  for (local_88 = 0; local_88 < Point_cnt; local_88 = local_88 + 1) {
    iVar1 = GridTest(p_gs,(double *)in_RDI);
    if (iVar1 != 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)p_gs,&in_RDI->xres);
    }
  }
  GridCleanup(in_RDX);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return (vector<int,_std::allocator<int>_> *)p_gs;
}

Assistant:

std::vector<int> QueryPolygonFromAddPointBeforeQueryPolygon(int n, std::vector<std::pair<double, double> > polygon) {
    ans.clear();
    GridSet grid_set;
    for (int i = 0; i < n; i++)
        pgon[i][0] = polygon[i].first,
        pgon[i][1] = polygon[i].second;
    GridSetup(pgon, n, Grid_Resolution, &grid_set);
    for (int i = 0; i<Point_cnt ; i++) {
        double point[2];
        point[0] = Point[i].first, point[1] = Point[i].second;
        if (GridTest(&grid_set, point))
            ans.push_back(Point_id[i]);
    }
    GridCleanup(&grid_set);
    return ans;
}